

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LA32WaveGenerator.cpp
# Opt level: O0

Bit16s __thiscall MT32Emu::LA32IntPartialPair::nextOutSample(LA32IntPartialPair *this)

{
  bool bVar1;
  Bit16s BVar2;
  Bit16s BVar3;
  Bit16s local_36;
  LogSample LStack_24;
  Bit16s ringModulatedSample;
  Bit16s local_1c;
  Bit16s local_1a;
  Bit16s slaveSample;
  LA32IntPartialPair *pLStack_18;
  Bit16s masterSample;
  LA32IntPartialPair *this_local;
  
  pLStack_18 = this;
  if ((this->ringModulated & 1U) == 0) {
    BVar2 = unlogAndMixWGOutput(&this->master);
    BVar3 = unlogAndMixWGOutput(&this->slave);
    this_local._6_2_ = BVar2 + BVar3;
  }
  else {
    local_1a = unlogAndMixWGOutput(&this->master);
    bVar1 = LA32WaveGenerator::isPCMWave(&this->slave);
    if (bVar1) {
      LStack_24 = LA32WaveGenerator::getOutputLogSample(&this->slave,true);
      local_36 = LA32Utilites::unlog(&stack0xffffffffffffffdc);
    }
    else {
      local_36 = unlogAndMixWGOutput(&this->slave);
    }
    local_1c = local_36;
    BVar2 = produceDistortedSample(local_1a);
    BVar3 = produceDistortedSample(local_1c);
    this_local._6_2_ = (short)((int)BVar2 * (int)BVar3 >> 0xd);
    if ((this->mixed & 1U) != 0) {
      this_local._6_2_ = local_1a + this_local._6_2_;
    }
  }
  return this_local._6_2_;
}

Assistant:

Bit16s LA32IntPartialPair::nextOutSample() {
	if (!ringModulated) {
		return unlogAndMixWGOutput(master) + unlogAndMixWGOutput(slave);
	}

	Bit16s masterSample = unlogAndMixWGOutput(master); // Store master partial sample for further mixing

	/* SEMI-CONFIRMED from sample analysis:
	 * We observe that for partial structures with ring modulation the interpolation is not applied to the slave PCM partial.
	 * It's assumed that the multiplication circuitry intended to perform the interpolation on the slave PCM partial
	 * is borrowed by the ring modulation circuit (or the LA32 chip has a similar lack of resources assigned to each partial pair).
	 */
	Bit16s slaveSample = slave.isPCMWave() ? LA32Utilites::unlog(slave.getOutputLogSample(true)) : unlogAndMixWGOutput(slave);

	/* SEMI-CONFIRMED: Ring modulation model derived from sample analysis of specially constructed patches which exploit distortion.
	 * LA32 ring modulator found to produce distorted output in case if the absolute value of maximal amplitude of one of the input partials exceeds 8191.
	 * This is easy to reproduce using synth partials with resonance values close to the maximum. It looks like an integer overflow happens in this case.
	 * As the distortion is strictly bound to the amplitude of the complete mixed square + resonance wave in the linear space,
	 * it is reasonable to assume the ring modulation is performed also in the linear space by sample multiplication.
	 * Most probably the overflow is caused by limited precision of the multiplication circuit as the very similar distortion occurs with panning.
	 */
	Bit16s ringModulatedSample = Bit16s((Bit32s(produceDistortedSample(masterSample)) * Bit32s(produceDistortedSample(slaveSample))) >> 13);

	return mixed ? masterSample + ringModulatedSample : ringModulatedSample;
}